

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O3

void __thiscall HighsInfo::invalidate(HighsInfo *this)

{
  (this->super_HighsInfoStruct).valid = false;
  *(undefined4 *)&(this->super_HighsInfoStruct).mip_node_count = 0xffffffff;
  *(undefined4 *)((long)&(this->super_HighsInfoStruct).mip_node_count + 4) = 0xffffffff;
  (this->super_HighsInfoStruct).simplex_iteration_count = -1;
  (this->super_HighsInfoStruct).ipm_iteration_count = -1;
  (this->super_HighsInfoStruct).ipm_iteration_count = -1;
  (this->super_HighsInfoStruct).crossover_iteration_count = -1;
  (this->super_HighsInfoStruct).pdlp_iteration_count = -1;
  (this->super_HighsInfoStruct).qp_iteration_count = -1;
  *(undefined1 (*) [16])&(this->super_HighsInfoStruct).primal_solution_status =
       (undefined1  [16])0x0;
  (this->super_HighsInfoStruct).objective_function_value = 0.0;
  (this->super_HighsInfoStruct).mip_dual_bound = 0.0;
  (this->super_HighsInfoStruct).mip_gap = INFINITY;
  (this->super_HighsInfoStruct).max_integrality_violation = INFINITY;
  (this->super_HighsInfoStruct).num_primal_infeasibilities = -1;
  (this->super_HighsInfoStruct).max_primal_infeasibility = INFINITY;
  (this->super_HighsInfoStruct).sum_primal_infeasibilities = INFINITY;
  (this->super_HighsInfoStruct).num_dual_infeasibilities = -1;
  (this->super_HighsInfoStruct).max_dual_infeasibility = INFINITY;
  (this->super_HighsInfoStruct).sum_dual_infeasibilities = INFINITY;
  (this->super_HighsInfoStruct).max_complementarity_violation = INFINITY;
  (this->super_HighsInfoStruct).sum_complementarity_violations = INFINITY;
  (this->super_HighsInfoStruct).primal_dual_integral = -INFINITY;
  return;
}

Assistant:

void HighsInfo::invalidate() {
  valid = false;
  mip_node_count = -1;
  simplex_iteration_count = -1;
  ipm_iteration_count = -1;
  crossover_iteration_count = -1;
  pdlp_iteration_count = -1;
  qp_iteration_count = -1;
  primal_solution_status = kSolutionStatusNone;
  dual_solution_status = kSolutionStatusNone;
  basis_validity = kBasisValidityInvalid;
  objective_function_value = 0;
  mip_dual_bound = 0;
  mip_gap = kHighsInf;
  max_integrality_violation = kHighsIllegalInfeasibilityMeasure;
  num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;
  primal_dual_integral = -kHighsInf;
}